

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::RescanRegExpNoAST
          (Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  EncodedCharPtr puVar1;
  code *pcVar2;
  bool bVar3;
  tokens tVar4;
  undefined4 *puVar5;
  char *message;
  char *error;
  uint lineNumber;
  undefined1 local_98 [8];
  ArenaAllocator alloc;
  
  tVar4 = this->m_ptoken->tk;
  if (tVar4 == tkAsgDiv) {
    if (this->m_currentCharacter == this->m_pchMinTok + 2) goto LAB_00f0131a;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    error = "(m_currentCharacter == m_pchMinTok + 2)";
    message = "m_currentCharacter == m_pchMinTok + 2";
    lineNumber = 0x310;
  }
  else if (tVar4 == tkDiv) {
    if (this->m_currentCharacter == this->m_pchMinTok + 1) goto LAB_00f0131a;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    error = "(m_currentCharacter == m_pchMinTok + 1)";
    message = "m_currentCharacter == m_pchMinTok + 1";
    lineNumber = 0x30d;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    error = "(0)";
    message = "Who is calling RescanRegExpNoParseTree?";
    lineNumber = 0x313;
  }
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                     ,lineNumber,error,message);
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00f0131a:
  puVar1 = this->m_pchMinTok;
  this->m_currentCharacter = puVar1;
  if (*puVar1 == '/') {
    this->m_currentCharacter = puVar1 + 1;
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_98,
               L"RescanRegExp",
               (this->m_parser->m_nodeAllocator).
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
               super_ArenaData.pageAllocator,
               (this->m_parser->m_nodeAllocator).
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
               super_Allocator.outOfMemoryFunc,JsUtil::ExternalApi::RecoverUnusedMemory);
    tVar4 = ScanRegExpConstantNoAST(this,(ArenaAllocator *)local_98);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_98);
    return tVar4;
  }
  Error(this,-0x7ff5fc0c);
}

Assistant:

tokens Scanner<EncodingPolicy>::RescanRegExpNoAST()
{
#if DEBUG
    switch (m_ptoken->tk)
    {
    case tkDiv:
        Assert(m_currentCharacter == m_pchMinTok + 1);
        break;
    case tkAsgDiv:
        Assert(m_currentCharacter == m_pchMinTok + 2);
        break;
    default:
        AssertMsg(FALSE, "Who is calling RescanRegExpNoParseTree?");
        break;
    }
#endif //DEBUG

    m_currentCharacter = m_pchMinTok;
    if (*m_currentCharacter != '/')
        Error(ERRnoSlash);
    m_currentCharacter++;

    tokens tk = tkNone;

    {
        ArenaAllocator alloc(_u("RescanRegExp"), m_parser->GetAllocator()->GetPageAllocator(), m_parser->GetAllocator()->outOfMemoryFunc);
        {
            tk = ScanRegExpConstantNoAST(&alloc);
        }
    }

    return tk;
}